

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

int mpack_tag_cmp(mpack_tag_t left,mpack_tag_t right)

{
  undefined4 uVar1;
  mpack_type_t mVar2;
  anon_union_8_8_6320e492_for_v aVar3;
  anon_union_8_8_6320e492_for_v aVar4;
  anon_union_8_8_6320e492_for_v local_30;
  mpack_tag_t right_local;
  mpack_tag_t left_local;
  
  aVar3 = right.v;
  aVar4 = left.v;
  left_local.v.l = left.type;
  right_local.v.l = right.type;
  if ((left_local.v.l == mpack_type_int) && (-1 < aVar4.i)) {
    left_local.v.f = 5.60519e-45;
  }
  if ((right_local.v.l == mpack_type_int) && (-1 < aVar3.i)) {
    right_local.v.f = 5.60519e-45;
  }
  if (left_local.v.l == right_local.v.l) {
    right_local.type = left.v._0_4_;
    mVar2 = right_local.type;
    local_30.l = right.v._0_4_;
    uVar1 = local_30.l;
    right_local.type._0_1_ = left.v._0_1_;
    local_30.b = right.v._0_1_;
    local_30.u = aVar3.u;
    right_local._8_8_ = aVar4.u;
    switch(left_local.v.l) {
    case 1:
      left_local._12_4_ = 0;
      break;
    case 2:
      left_local._12_4_ =
           (uint)(byte)((undefined1)right_local.type & mpack_type_nil) -
           (uint)(byte)(local_30.ext.exttype & mpack_type_nil);
      break;
    case 3:
      if (aVar4.u == aVar3.u) {
        left_local._12_4_ = 0;
      }
      else {
        left_local._12_4_ = 1;
        if (aVar4.i < aVar3.i) {
          left_local._12_4_ = 0xffffffff;
        }
      }
      break;
    case 4:
      if (aVar4.u == aVar3.u) {
        left_local._12_4_ = 0;
      }
      else {
        left_local._12_4_ = 1;
        if (aVar4.u < aVar3.u) {
          left_local._12_4_ = 0xffffffff;
        }
      }
      break;
    case 5:
      left_local._12_4_ = memcmp(&right_local.type,&local_30,4);
      break;
    case 6:
      left_local._12_4_ = memcmp(&right_local.type,&local_30,8);
      break;
    case 7:
    case 8:
      if (mVar2 == uVar1) {
        left_local._12_4_ = 0;
      }
      else {
        left_local._12_4_ = 1;
        if (mVar2 < (uint)uVar1) {
          left_local._12_4_ = 0xffffffff;
        }
      }
      break;
    case 9:
      if ((_Bool)(undefined1)right_local.type == local_30.b) {
        right_local._12_4_ = left.v._4_4_;
        local_30.ext.length = right.v._4_4_;
        if (right_local._12_4_ == local_30.ext.length) {
          left_local._12_4_ = 0;
        }
        else {
          left_local._12_4_ = 1;
          if ((uint)right_local._12_4_ < local_30.ext.length) {
            left_local._12_4_ = 0xffffffff;
          }
        }
      }
      else {
        left_local._12_4_ = (int)(char)(undefined1)right_local.type - (int)local_30.ext.exttype;
      }
      break;
    case 10:
    case 0xb:
      if (mVar2 == uVar1) {
        left_local._12_4_ = 0;
      }
      else {
        left_local._12_4_ = 1;
        if (mVar2 < (uint)uVar1) {
          left_local._12_4_ = 0xffffffff;
        }
      }
    }
  }
  else {
    left_local._12_4_ = left_local.v.l - right_local.v._0_4_;
  }
  return left_local._12_4_;
}

Assistant:

int mpack_tag_cmp(mpack_tag_t left, mpack_tag_t right) {

    // positive numbers may be stored as int; convert to uint
    if (left.type == mpack_type_int && left.v.i >= 0) {
        left.type = mpack_type_uint;
        left.v.u = (uint64_t)left.v.i;
    }
    if (right.type == mpack_type_int && right.v.i >= 0) {
        right.type = mpack_type_uint;
        right.v.u = (uint64_t)right.v.i;
    }

    if (left.type != right.type)
        return (int)left.type - (int)right.type;

    switch (left.type) {
        case mpack_type_nil:
            return 0;

        case mpack_type_bool:
            return (int)left.v.b - (int)right.v.b;

        case mpack_type_int:
            if (left.v.i == right.v.i)
                return 0;
            return (left.v.i < right.v.i) ? -1 : 1;

        case mpack_type_uint:
            if (left.v.u == right.v.u)
                return 0;
            return (left.v.u < right.v.u) ? -1 : 1;

        case mpack_type_array:
        case mpack_type_map:
            if (left.v.n == right.v.n)
                return 0;
            return (left.v.n < right.v.n) ? -1 : 1;

        case mpack_type_str:
        case mpack_type_bin:
            if (left.v.l == right.v.l)
                return 0;
            return (left.v.l < right.v.l) ? -1 : 1;

        case mpack_type_ext:
            if (left.v.ext.exttype == right.v.ext.exttype) {
                if (left.v.ext.length == right.v.ext.length)
                    return 0;
                return (left.v.ext.length < right.v.ext.length) ? -1 : 1;
            }
            return (int)left.v.ext.exttype - (int)right.v.ext.exttype;

        // floats should not normally be compared for equality. we compare
        // with memcmp() to silence compiler warnings, but this will return
        // equal if both are NaNs with the same representation (though we may
        // want this, for instance if you are for some bizarre reason using
        // floats as map keys.) i'm not sure what the right thing to
        // do is here. check for NaN first? always return false if the type
        // is float? use operator== and pragmas to silence compiler warning?
        // please send me your suggestions.
        // note also that we don't convert floats to doubles, so when this is
        // used for ordering purposes, all floats are ordered before all
        // doubles.
        case mpack_type_float:
            return mpack_memcmp(&left.v.f, &right.v.f, sizeof(left.v.f));
        case mpack_type_double:
            return mpack_memcmp(&left.v.d, &right.v.d, sizeof(left.v.d));

        default:
            break;
    }
    
    mpack_assert(0, "unrecognized type %i", (int)left.type);
    return false;
}